

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O3

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveImportObj(Parser *parser,int flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  Token *token;
  DirectiveObjImport *pDVar4;
  DirectivePsxObjImport *this;
  undefined4 in_register_00000034;
  Parser *this_00;
  Identifier ctorName;
  StringLiteral inputName;
  vector<Expression,_std::allocator<Expression>_> list;
  Identifier local_a8;
  StringLiteral local_88;
  path local_68;
  vector<Expression,_std::allocator<Expression>_> local_48;
  
  this_00 = (Parser *)CONCAT44(in_register_00000034,flags);
  token = Tokenizer::peekToken
                    ((this_00->entries).
                     super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  local_48.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (Expression *)0x0;
  local_48.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = Parser::parseExpressionList(this_00,&local_48,1,2);
  if (bVar3) {
    paVar1 = &local_88._value.field_2;
    local_88._value._M_string_length = 0;
    local_88._value.field_2._M_local_buf[0] = '\0';
    local_88._value._M_dataplus._M_p = (pointer)paVar1;
    bVar3 = Expression::evaluateString
                      (local_48.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                       super__Vector_impl_data._M_start,&local_88,true);
    if (bVar3) {
      if ((long)local_48.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_48.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                super__Vector_impl_data._M_start == 0x30) {
        paVar2 = &local_a8._name.field_2;
        local_a8._name._M_string_length = 0;
        local_a8._name.field_2._M_local_buf[0] = '\0';
        local_a8._name._M_dataplus._M_p = (pointer)paVar2;
        bVar3 = Expression::evaluateIdentifier
                          (local_48.super__Vector_base<Expression,_std::allocator<Expression>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1,&local_a8);
        if (bVar3) {
          if (Mips.Version == MARCH_PSX) {
            StringLiteral::path(&local_68,&local_88);
            pDVar4 = (DirectiveObjImport *)operator_new(0x78);
            DirectiveObjImport::DirectiveObjImport(pDVar4,&local_68,&local_a8);
            ghc::filesystem::path::~path(&local_68);
            if ((pDVar4->super_CAssemblerCommand).field_0x14 == '\0') {
              Parser::printError<>
                        (this_00,token,"Constructor not supported for non-ELF PSX libraries");
              std::make_unique<InvalidCommand>();
              (parser->entries).
              super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)local_68._path._M_dataplus._M_p;
              (*(pDVar4->super_CAssemblerCommand)._vptr_CAssemblerCommand[1])(pDVar4);
            }
            else {
              (parser->entries).
              super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)pDVar4;
            }
          }
          else {
            StringLiteral::path(&local_68,&local_88);
            pDVar4 = (DirectiveObjImport *)operator_new(0x78);
            DirectiveObjImport::DirectiveObjImport(pDVar4,&local_68,&local_a8);
            (parser->entries).
            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)pDVar4;
            ghc::filesystem::path::~path(&local_68);
          }
        }
        else {
          (parser->entries).
          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._name._M_dataplus._M_p != paVar2) {
          operator_delete(local_a8._name._M_dataplus._M_p,
                          CONCAT71(local_a8._name.field_2._M_allocated_capacity._1_7_,
                                   local_a8._name.field_2._M_local_buf[0]) + 1);
        }
      }
      else if (Mips.Version == MARCH_PSX) {
        StringLiteral::path((path *)&local_a8,&local_88);
        this = (DirectivePsxObjImport *)operator_new(0x58);
        DirectivePsxObjImport::DirectivePsxObjImport(this,(path *)&local_a8);
        ghc::filesystem::path::~path((path *)&local_a8);
        if ((this->super_CAssemblerCommand).field_0x14 == '\0') {
          StringLiteral::path((path *)&local_a8,&local_88);
          pDVar4 = (DirectiveObjImport *)operator_new(0x78);
          DirectiveObjImport::DirectiveObjImport(pDVar4,(path *)&local_a8);
          (parser->entries).
          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pDVar4;
          ghc::filesystem::path::~path((path *)&local_a8);
          (*(this->super_CAssemblerCommand)._vptr_CAssemblerCommand[1])(this);
        }
        else {
          (parser->entries).
          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)this;
        }
      }
      else {
        StringLiteral::path((path *)&local_a8,&local_88);
        pDVar4 = (DirectiveObjImport *)operator_new(0x78);
        DirectiveObjImport::DirectiveObjImport(pDVar4,(path *)&local_a8);
        (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)pDVar4;
        ghc::filesystem::path::~path((path *)&local_a8);
      }
    }
    else {
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._value._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._value._M_dataplus._M_p,
                      CONCAT71(local_88._value.field_2._M_allocated_capacity._1_7_,
                               local_88._value.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  std::vector<Expression,_std::allocator<Expression>_>::~vector(&local_48);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveImportObj(Parser& parser, int flags)
{
	const Token& start = parser.peekToken();

	std::vector<Expression> list;
	if (!parser.parseExpressionList(list,1,2))
		return nullptr;

	StringLiteral inputName;
	if (!list[0].evaluateString(inputName,true))
		return nullptr;
	
	if (list.size() == 2)
	{
		Identifier ctorName;
		if (!list[1].evaluateIdentifier(ctorName))
			return nullptr;
		
		if (Mips.GetVersion() == MARCH_PSX)
		{
			auto attempt = std::make_unique<DirectiveObjImport>(inputName.path(),ctorName);
			if (!attempt->isSuccessfullyImported())
			{
				parser.printError(start, "Constructor not supported for non-ELF PSX libraries");
				return std::make_unique<InvalidCommand>();
			}
			else
			{
				return attempt;
			}
		}

		return std::make_unique<DirectiveObjImport>(inputName.path(),ctorName);
	}

	if (Mips.GetVersion() == MARCH_PSX)
	{
		// Fallback to ELF, if the PSX library importer fails.
		auto psxLib = std::make_unique<DirectivePsxObjImport>(inputName.path());
		if (!psxLib->isSuccessfullyImported())
			return std::make_unique<DirectiveObjImport>(inputName.path());
		else
			return psxLib;
	}
	else
	{
		return std::make_unique<DirectiveObjImport>(inputName.path());
	}
}